

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

void av1_find_best_ref_mvs
               (int allow_hp,int_mv *mvlist,int_mv *nearest_mv,int_mv *near_mv,int is_integer)

{
  ushort uVar1;
  long lVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  
  lVar2 = 2;
  do {
    if (is_integer == 0) {
      if (allow_hp == 0) {
        uVar1 = *(ushort *)((long)mvlist + lVar2 + -2);
        if ((uVar1 & 1) != 0) {
          *(ushort *)((long)mvlist + lVar2 + -2) = uVar1 + (ushort)((short)uVar1 < 1) * 2 + -1;
        }
        uVar1 = *(ushort *)((long)mvlist + lVar2);
        if ((uVar1 & 1) != 0) {
          *(ushort *)((long)mvlist + lVar2) = uVar1 + (ushort)((short)uVar1 < 1) * 2 + -1;
        }
      }
    }
    else {
      sVar3 = *(short *)((long)mvlist + lVar2 + -2);
      uVar4 = (int)sVar3 % 8;
      if (uVar4 != 0) {
        sVar3 = sVar3 - (short)uVar4;
        *(short *)((long)mvlist + lVar2 + -2) = sVar3;
        uVar5 = -uVar4;
        if (0 < (int)uVar4) {
          uVar5 = uVar4;
        }
        if (4 < uVar5) {
          *(ushort *)((long)mvlist + lVar2 + -2) = sVar3 + (ushort)(0 < (int)uVar4) * 0x10 + -8;
        }
      }
      uVar4 = (int)*(short *)((long)mvlist + lVar2) % 8;
      if (uVar4 != 0) {
        sVar3 = *(short *)((long)mvlist + lVar2) - (short)uVar4;
        *(short *)((long)mvlist + lVar2) = sVar3;
        uVar5 = -uVar4;
        if (0 < (int)uVar4) {
          uVar5 = uVar4;
        }
        if (4 < uVar5) {
          if ((int)uVar4 < 1) {
            sVar3 = sVar3 + -8;
          }
          else {
            sVar3 = sVar3 + 8;
          }
          *(short *)((long)mvlist + lVar2) = sVar3;
        }
      }
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 == 6);
  *nearest_mv = *mvlist;
  *near_mv = mvlist[1];
  return;
}

Assistant:

void av1_find_best_ref_mvs(int allow_hp, int_mv *mvlist, int_mv *nearest_mv,
                           int_mv *near_mv, int is_integer) {
  int i;
  // Make sure all the candidates are properly clamped etc
  for (i = 0; i < MAX_MV_REF_CANDIDATES; ++i) {
    lower_mv_precision(&mvlist[i].as_mv, allow_hp, is_integer);
  }
  *nearest_mv = mvlist[0];
  *near_mv = mvlist[1];
}